

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.hpp
# Opt level: O1

ssize_t __thiscall
trial::protocol::buffer::array<unsigned_char,_1UL,_trial::protocol::buffer::base<unsigned_char>_>::
write(array<unsigned_char,_1UL,_trial::protocol::buffer::base<unsigned_char>_> *this,int __fd,
     void *__buf,size_t __n)

{
  size_t __n_00;
  iterator __dest;
  int iVar1;
  undefined4 extraout_var;
  void *pvVar2;
  undefined4 in_register_00000034;
  size_t *psVar3;
  ptrdiff_t _Num;
  
  psVar3 = (size_t *)CONCAT44(in_register_00000034,__fd);
  iVar1 = (*(this->super_base<unsigned_char>)._vptr_base[2])(this,*psVar3);
  pvVar2 = (void *)CONCAT44(extraout_var,iVar1);
  if ((char)iVar1 != '\0') {
    __n_00 = *psVar3;
    __dest = this->current;
    if (__n_00 != 0) {
      pvVar2 = memmove(__dest,(void *)psVar3[1],__n_00);
    }
    this->current = __dest + __n_00;
    return (ssize_t)pvVar2;
  }
  __assert_fail("grow(view.size())",
                "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/cmake/../include/trial/protocol/buffer/array.hpp"
                ,0x4b,
                "virtual void trial::protocol::buffer::array<unsigned char, 1>::write(const view_type &) [CharT = unsigned char, N = 1, Super = trial::protocol::buffer::base<unsigned char>]"
               );
}

Assistant:

virtual void write(const view_type& view)
    {
        assert(grow(view.size()));
        current = std::copy(view.begin(), view.end(), current);
    }